

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O2

TestStatus * __thiscall
vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorPool::Parameters>::iterate
          (TestStatus *__return_storage_ptr__,
          FunctionInstance1<vkt::api::(anonymous_namespace)::DescriptorPool::Parameters> *this)

{
  Context *pCVar1;
  Function p_Var2;
  Parameters in_stack_ffffffffffffffb8;
  Parameters local_40;
  
  pCVar1 = (this->super_TestInstance).m_context;
  p_Var2 = (this->m_args).func;
  api::anon_unknown_1::DescriptorPool::Parameters::Parameters(&local_40,&(this->m_args).arg0);
  (*p_Var2)(__return_storage_ptr__,pCVar1,in_stack_ffffffffffffffb8);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base(&local_40.poolSizes.
                 super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
               );
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus	iterate				(void) { return m_args.func(m_context, m_args.arg0); }